

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.h
# Opt level: O2

void pztopology::TPZLine::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = (double)(int)(-(uint)(*transformationIds->fStore != 0) | 1) * 0.5;
  pdVar1 = TPZFMatrix<double>::operator()(directions,0,0);
  *pdVar1 = dVar2;
  pdVar1 = TPZFMatrix<double>::operator()(directions,0,1);
  *pdVar1 = dVar2;
  pdVar1 = TPZFMatrix<double>::operator()(directions,0,2);
  *pdVar1 = dVar2;
  return;
}

Assistant:

static constexpr MElementType Type() {return EOned;}